

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-all.cc
# Opt level: O3

AssertionResult __thiscall
testing::internal::CmpHelperEQ
          (internal *this,char *lhs_expression,char *rhs_expression,BiggestInt lhs,BiggestInt rhs)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *extraout_RDX_00;
  AssertionResult AVar1;
  BiggestInt local_68;
  BiggestInt local_60;
  string local_58;
  string local_38;
  
  if (lhs == rhs) {
    *this = (internal)0x1;
    *(undefined8 *)(this + 8) = 0;
  }
  else {
    local_68 = rhs;
    local_60 = lhs;
    PrintToString<long_long>(&local_38,&local_60);
    PrintToString<long_long>(&local_58,&local_68);
    AVar1 = EqFailure(this,lhs_expression,rhs_expression,&local_38,&local_58,false);
    rhs_expression = (char *)AVar1.message_.ptr_;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
      rhs_expression = (char *)extraout_RDX;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_38._M_dataplus._M_p != &local_38.field_2) {
      operator_delete(local_38._M_dataplus._M_p);
      rhs_expression = (char *)extraout_RDX_00;
    }
  }
  AVar1.message_.ptr_ =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)rhs_expression;
  AVar1._0_8_ = this;
  return AVar1;
}

Assistant:

AssertionResult CmpHelperEQ(const char* lhs_expression,
                            const char* rhs_expression,
                            BiggestInt lhs,
                            BiggestInt rhs) {
  if (lhs == rhs) {
    return AssertionSuccess();
  }

  return EqFailure(lhs_expression,
                   rhs_expression,
                   FormatForComparisonFailureMessage(lhs, rhs),
                   FormatForComparisonFailureMessage(rhs, lhs),
                   false);
}